

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  byte bVar1;
  bool bVar2;
  uint *in_RCX;
  uint *in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  uint *in_R8;
  byte in_R9B;
  uint i;
  float axis [3];
  uint ave_color [3];
  uint8 *in_stack_00000060;
  uint *in_stack_00000068;
  uint *in_stack_00000070;
  color_quad_u8 *in_stack_00000078;
  uint in_stack_00000080;
  float *in_stack_000000e8;
  uint *in_stack_000000f0;
  uint *in_stack_000000f8;
  uint *in_stack_00000100;
  color_quad_u8 *in_stack_00000108;
  uint in_stack_00000110;
  float *in_stack_000001d8;
  uint8 *in_stack_000001e0;
  uint *in_stack_000001e8;
  uint *in_stack_000001f0;
  color_quad_u8 *in_stack_000001f8;
  uint in_stack_00000204;
  undefined4 local_48;
  uint8 *in_stack_ffffffffffffffc0;
  uint *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  
  bVar1 = in_R9B & 1;
  bVar2 = optimize_block_colors
                    (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                     in_stack_000000f0,in_stack_000000e8);
  if (bVar2) {
    bVar2 = determine_selectors(i,(color_quad_u8 *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                                (uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(uint8 *)in_RDX);
    if (bVar2) {
      bVar2 = refine_block(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                           in_stack_00000060);
      if (bVar2) {
        determine_selectors(i,(color_quad_u8 *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                            (uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(uint8 *)in_RDX);
      }
      if ((bVar1 & 1) != 0) {
        refine_endpoints2(in_stack_00000204,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                          in_stack_000001e0,in_stack_000001d8);
      }
    }
    else {
      compress_solid_block
                ((uint)((ulong)in_RCX >> 0x20),in_R8,
                 (uint *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
    }
  }
  else {
    compress_solid_block
              ((uint)((ulong)in_RCX >> 0x20),in_R8,(uint *)CONCAT17(bVar1,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  if (*in_RDX < *in_RCX) {
    utils::swap<unsigned_int>(in_RDX,in_RCX);
    for (local_48 = 0; local_48 < in_EDI; local_48 = local_48 + 1) {
      *(byte *)((long)in_R8 + (ulong)local_48) = *(byte *)((long)in_R8 + (ulong)local_48) ^ 1;
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine) {
  CRNLIB_ASSERT((n & 15) == 0);

  uint ave_color[3];
  float axis[3];

  if (!optimize_block_colors(n, block, low16, high16, ave_color, axis)) {
    compress_solid_block(n, ave_color, low16, high16, pSelectors);
  } else {
    if (!determine_selectors(n, block, low16, high16, pSelectors))
      compress_solid_block(n, ave_color, low16, high16, pSelectors);
    else {
      if (refine_block(n, block, low16, high16, pSelectors))
        determine_selectors(n, block, low16, high16, pSelectors);

      if (refine)
        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
    }
  }

  if (low16 < high16) {
    utils::swap(low16, high16);
    for (uint i = 0; i < n; i++)
      pSelectors[i] ^= 1;
  }
}